

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O0

int __thiscall Fl_Pixmap::copy(Fl_Pixmap *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  char **ppcVar5;
  ulong uVar6;
  size_t sVar7;
  char *pcVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  uint local_194;
  int chars_per_line;
  int chars_per_pixel;
  int ncolors;
  int ystep;
  int xstep;
  int ymod;
  int xmod;
  int yerr;
  int xerr;
  int dy;
  int dx;
  int sy;
  int c;
  int i;
  char *old_ptr;
  char new_info [255];
  char *local_50;
  char *new_ptr;
  char **new_row;
  char **new_data;
  Fl_Pixmap *new_image;
  int H_local;
  int W_local;
  Fl_Pixmap *this_local;
  
  iVar11 = (int)dst;
  iVar10 = (int)src;
  iVar3 = Fl_Image::w(&this->super_Fl_Image);
  if ((iVar11 == iVar3) && (iVar3 = Fl_Image::h(&this->super_Fl_Image), iVar10 == iVar3)) {
    this_local = (Fl_Pixmap *)operator_new(0x38);
    ppcVar5 = Fl_Image::data(&this->super_Fl_Image);
    Fl_Pixmap(this_local,ppcVar5);
    copy_data(this_local);
  }
  else if ((iVar11 < 1) || (iVar10 < 1)) {
    this_local = (Fl_Pixmap *)0x0;
  }
  else {
    ppcVar5 = Fl_Image::data(&this->super_Fl_Image);
    __isoc99_sscanf(*ppcVar5,"%*d%*d%d%d",&chars_per_line,&local_194);
    iVar3 = local_194 * iVar11;
    sprintf((char *)&old_ptr,"%d %d %d %d",(ulong)dst & 0xffffffff,(ulong)src & 0xffffffff,
            (ulong)(uint)chars_per_line,(ulong)local_194);
    iVar4 = Fl_Image::w(&this->super_Fl_Image);
    xstep = iVar4 % iVar11;
    iVar4 = Fl_Image::w(&this->super_Fl_Image);
    ncolors = (iVar4 / iVar11) * local_194;
    iVar4 = Fl_Image::h(&this->super_Fl_Image);
    ystep = iVar4 % iVar10;
    iVar4 = Fl_Image::h(&this->super_Fl_Image);
    chars_per_pixel = iVar4 / iVar10;
    if (chars_per_line < 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(iVar10 + 2);
      uVar6 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      new_row = (char **)operator_new__(uVar6);
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(iVar10 + chars_per_line + 1);
      uVar6 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      new_row = (char **)operator_new__(uVar6);
    }
    sVar7 = strlen((char *)&old_ptr);
    pcVar8 = (char *)operator_new__(sVar7 + 1);
    *new_row = pcVar8;
    strcpy(*new_row,(char *)&old_ptr);
    if (chars_per_line < 0) {
      iVar4 = chars_per_line * -4;
      chars_per_line = -chars_per_line;
      pcVar8 = (char *)operator_new__((long)iVar4);
      new_row[1] = pcVar8;
      pcVar8 = new_row[1];
      ppcVar5 = Fl_Image::data(&this->super_Fl_Image);
      memcpy(pcVar8,ppcVar5[1],(long)(chars_per_line << 2));
      chars_per_line = 1;
      new_ptr = (char *)(new_row + 2);
    }
    else {
      new_ptr = (char *)new_row;
      for (sy = 0; new_ptr = (char *)((long)new_ptr + 8), sy < chars_per_line; sy = sy + 1) {
        ppcVar5 = Fl_Image::data(&this->super_Fl_Image);
        sVar7 = strlen(ppcVar5[sy + 1]);
        pvVar9 = operator_new__(sVar7 + 1);
        *(void **)new_ptr = pvVar9;
        pcVar8 = *(char **)new_ptr;
        ppcVar5 = Fl_Image::data(&this->super_Fl_Image);
        strcpy(pcVar8,ppcVar5[sy + 1]);
      }
    }
    dy = 0;
    ymod = iVar10;
    for (yerr = iVar10; 0 < yerr; yerr = yerr + -1) {
      pvVar9 = operator_new__((long)(iVar3 + 1));
      *(void **)new_ptr = pvVar9;
      local_50 = *(char **)new_ptr;
      xmod = iVar11;
      xerr = iVar11;
      ppcVar5 = Fl_Image::data(&this->super_Fl_Image);
      _c = ppcVar5[dy + chars_per_line + 1];
      for (; 0 < xerr; xerr = xerr + -1) {
        for (dx = 0; dx < (int)local_194; dx = dx + 1) {
          *local_50 = _c[dx];
          local_50 = local_50 + 1;
        }
        _c = _c + ncolors;
        xmod = xmod - xstep;
        if (xmod < 1) {
          xmod = iVar11 + xmod;
          _c = _c + (int)local_194;
        }
      }
      *local_50 = '\0';
      dy = chars_per_pixel + dy;
      ymod = ymod - ystep;
      if (ymod < 1) {
        ymod = iVar10 + ymod;
        dy = dy + 1;
      }
      new_ptr = new_ptr + 8;
    }
    this_local = (Fl_Pixmap *)operator_new(0x38);
    Fl_Pixmap(this_local,new_row);
    this_local->alloc_data = 1;
  }
  return (int)this_local;
}

Assistant:

Fl_Image *Fl_Pixmap::copy(int W, int H) {
  Fl_Pixmap	*new_image;	// New pixmap

  // Optimize the simple copy where the width and height are the same...
  if (W == w() && H == h()) {
    // Make an exact copy of the image and return it...
    new_image = new Fl_Pixmap(data());
    new_image->copy_data();
    return new_image;
  }
  if (W <= 0 || H <= 0) return 0;

  // OK, need to resize the image data; allocate memory and
  char		**new_data,	// New array for image data
		**new_row,	// Pointer to row in image data
		*new_ptr,	// Pointer into new array
		new_info[255];	// New information line
  const char	*old_ptr;	// Pointer into old array
  int		i,		// Looping var
		c,		// Channel number
		sy,		// Source coordinate
		dx, dy,		// Destination coordinates
		xerr, yerr,	// X & Y errors
		xmod, ymod,	// X & Y moduli
		xstep, ystep;	// X & Y step increments
  int		ncolors,	// Number of colors in image
		chars_per_pixel,// Characters per color
		chars_per_line;	// Characters per line

  // Figure out how many colors there are, and how big they are...
  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);
  chars_per_line = chars_per_pixel * W + 1;

  sprintf(new_info, "%d %d %d %d", W, H, ncolors, chars_per_pixel);

  // Figure out Bresenham step/modulus values...
  xmod   = w() % W;
  xstep  = (w() / W) * chars_per_pixel;
  ymod   = h() % H;
  ystep  = h() / H;

  // Allocate memory for the new array...
  if (ncolors < 0) new_data = new char *[H + 2];
  else new_data = new char *[H + ncolors + 1];
  new_data[0] = new char[strlen(new_info) + 1];
  strcpy(new_data[0], new_info);

  // Copy colors...
  if (ncolors < 0) {
    // Copy FLTK colormap values...
    ncolors = -ncolors;
    new_row = new_data + 1;
    *new_row = new char[ncolors * 4];
    memcpy(*new_row, data()[1], ncolors * 4);
    ncolors = 1;
    new_row ++;
  } else {
    // Copy standard XPM colormap values...
    for (i = 0, new_row = new_data + 1; i < ncolors; i ++, new_row ++) {
      *new_row = new char[strlen(data()[i + 1]) + 1];
      strcpy(*new_row, data()[i + 1]);
    }
  }

  // Scale the image using a nearest-neighbor algorithm...
  for (dy = H, sy = 0, yerr = H; dy > 0; dy --, new_row ++) {
    *new_row = new char[chars_per_line];
    new_ptr  = *new_row;

    for (dx = W, xerr = W, old_ptr = data()[sy + ncolors + 1];
	 dx > 0;
	 dx --) {
      for (c = 0; c < chars_per_pixel; c ++) *new_ptr++ = old_ptr[c];

      old_ptr += xstep;
      xerr    -= xmod;

      if (xerr <= 0) {
	xerr    += W;
	old_ptr += chars_per_pixel;
      }
    }

    *new_ptr = '\0';
    sy       += ystep;
    yerr     -= ymod;
    if (yerr <= 0) {
      yerr += H;
      sy ++;
    }
  }

  new_image = new Fl_Pixmap((char*const*)new_data);
  new_image->alloc_data = 1;

  return new_image;
}